

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O1

Session * __thiscall FIX::Acceptor::getSession(Acceptor *this,string *msg,Responder *responder)

{
  Header *this_00;
  bool bVar1;
  int iVar2;
  iterator iVar3;
  _Rb_tree_header *p_Var4;
  TargetCompID clTargetCompID;
  SenderCompID clSenderCompID;
  MsgType msgType;
  BeginString beginString;
  TargetCompID targetCompID;
  SenderCompID senderCompID;
  SessionID sessionID;
  Message message;
  string local_550;
  FieldBase local_530;
  FieldBase local_4d0;
  FieldBase local_470;
  FieldBase local_410;
  FieldBase local_3b0;
  FieldBase local_350;
  SessionID local_2f0;
  Message local_188;
  
  Message::Message(&local_188);
  bVar1 = Message::setStringHeader(&local_188,msg);
  if (!bVar1) {
    responder = (Responder *)0x0;
    goto LAB_00150935;
  }
  StringField::StringField((StringField *)&local_410,8);
  local_410._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001ed508;
  StringField::StringField((StringField *)&local_4d0,0x31);
  local_4d0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001ed5a8;
  StringField::StringField((StringField *)&local_530,0x38);
  local_530._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001ed5e0;
  StringField::StringField((StringField *)&local_470,0x23);
  local_470._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001ed708;
  this_00 = &local_188.m_header;
  FieldMap::getField(&this_00->super_FieldMap,&local_410);
  FieldMap::getField(&this_00->super_FieldMap,&local_4d0);
  FieldMap::getField(&this_00->super_FieldMap,&local_530);
  FieldMap::getField(&this_00->super_FieldMap,&local_470);
  iVar2 = std::__cxx11::string::compare((char *)&local_470.m_string);
  if (iVar2 == 0) {
    local_350._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001ed588;
    local_350.m_tag = 0x31;
    local_350.m_string._M_dataplus._M_p = (pointer)&local_350.m_string.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_350.m_string,local_530.m_string._M_dataplus._M_p,
               local_530.m_string._M_dataplus._M_p + local_530.m_string._M_string_length);
    local_350.m_data._M_dataplus._M_p = (pointer)&local_350.m_data.field_2;
    local_350.m_data._M_string_length = 0;
    local_350.m_data.field_2._M_local_buf[0] = '\0';
    local_350.m_metrics.m_length = 0;
    local_350.m_metrics.m_checksum = 0;
    local_350._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001ed5a8;
    local_3b0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001ed588;
    local_3b0.m_tag = 0x38;
    local_3b0.m_string._M_dataplus._M_p = (pointer)&local_3b0.m_string.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3b0.m_string,local_4d0.m_string._M_dataplus._M_p,
               local_4d0.m_string._M_dataplus._M_p + local_4d0.m_string._M_string_length);
    local_3b0.m_data._M_dataplus._M_p = (pointer)&local_3b0.m_data.field_2;
    local_3b0.m_data._M_string_length = 0;
    local_3b0.m_data.field_2._M_local_buf[0] = '\0';
    local_3b0.m_metrics.m_length = 0;
    local_3b0.m_metrics.m_checksum = 0;
    local_3b0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001ed5e0;
    local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"");
    SessionID::SessionID
              (&local_2f0,&local_410.m_string,&local_350.m_string,&local_3b0.m_string,&local_550);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != &local_550.field_2) {
      operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
    }
    iVar3 = std::
            _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Session_*>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Session_*>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
            ::find(&(this->m_sessions)._M_t,&local_2f0);
    p_Var4 = &(this->m_sessions)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar3._M_node != p_Var4) {
      Session::setResponder((Session *)iVar3._M_node[0xc]._M_parent,responder);
      responder = (Responder *)iVar3._M_node[0xc]._M_parent;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0.m_frozenString._M_dataplus._M_p != &local_2f0.m_frozenString.field_2) {
      operator_delete(local_2f0.m_frozenString._M_dataplus._M_p,
                      local_2f0.m_frozenString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0.m_sessionQualifier._M_dataplus._M_p != &local_2f0.m_sessionQualifier.field_2) {
      operator_delete(local_2f0.m_sessionQualifier._M_dataplus._M_p,
                      local_2f0.m_sessionQualifier.field_2._M_allocated_capacity + 1);
    }
    FieldBase::~FieldBase((FieldBase *)&local_2f0.m_targetCompID);
    FieldBase::~FieldBase((FieldBase *)&local_2f0.m_senderCompID);
    FieldBase::~FieldBase((FieldBase *)&local_2f0);
    FieldBase::~FieldBase(&local_3b0);
    FieldBase::~FieldBase(&local_350);
    if ((_Rb_tree_header *)iVar3._M_node == p_Var4) goto LAB_0015071a;
  }
  else {
LAB_0015071a:
    responder = (Responder *)0x0;
  }
  FieldBase::~FieldBase(&local_470);
  FieldBase::~FieldBase(&local_530);
  FieldBase::~FieldBase(&local_4d0);
  FieldBase::~FieldBase(&local_410);
LAB_00150935:
  Message::~Message(&local_188);
  return (Session *)responder;
}

Assistant:

Session* Acceptor::getSession
( const std::string& msg, Responder& responder )
{
  Message message;
  if ( !message.setStringHeader( msg ) )
    return 0;

  BeginString beginString;
  SenderCompID clSenderCompID;
  TargetCompID clTargetCompID;
  MsgType msgType;
  try
  {
    message.getHeader().getField( beginString );
    message.getHeader().getField( clSenderCompID );
    message.getHeader().getField( clTargetCompID );
    message.getHeader().getField( msgType );
    if ( msgType != "A" ) return 0;

    SenderCompID senderCompID( clTargetCompID );
    TargetCompID targetCompID( clSenderCompID );
    SessionID sessionID( beginString, senderCompID, targetCompID );

    Sessions::iterator i = m_sessions.find( sessionID );
    if ( i != m_sessions.end() )
    {
      i->second->setResponder( &responder );
      return i->second;
    }
  }
  catch ( FieldNotFound& ) {}
  return 0;
}